

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O1

void __thiscall RTQuaternion::toEuler(RTQuaternion *this,RTVector3 *vec)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  
  fVar1 = this->m_data[1];
  fVar2 = this->m_data[2];
  dVar3 = (double)(this->m_data[3] * fVar2 + this->m_data[0] * fVar1);
  dVar4 = (double)(fVar1 * fVar1 + fVar2 * fVar2);
  dVar3 = atan2(dVar3 + dVar3,1.0 - (dVar4 + dVar4));
  vec->m_data[0] = (float)dVar3;
  dVar3 = (double)(this->m_data[0] * this->m_data[2] - this->m_data[3] * this->m_data[1]);
  dVar3 = asin(dVar3 + dVar3);
  vec->m_data[1] = (float)dVar3;
  fVar1 = this->m_data[2];
  fVar2 = this->m_data[3];
  dVar3 = (double)(this->m_data[1] * fVar1 + this->m_data[0] * fVar2);
  dVar4 = (double)(fVar1 * fVar1 + fVar2 * fVar2);
  dVar3 = atan2(dVar3 + dVar3,1.0 - (dVar4 + dVar4));
  vec->m_data[2] = (float)dVar3;
  return;
}

Assistant:

void RTQuaternion::toEuler(RTVector3& vec)
{
    vec.setX(atan2(2.0 * (m_data[2] * m_data[3] + m_data[0] * m_data[1]),
            1 - 2.0 * (m_data[1] * m_data[1] + m_data[2] * m_data[2])));

    vec.setY(asin(2.0 * (m_data[0] * m_data[2] - m_data[1] * m_data[3])));

    vec.setZ(atan2(2.0 * (m_data[1] * m_data[2] + m_data[0] * m_data[3]),
            1 - 2.0 * (m_data[2] * m_data[2] + m_data[3] * m_data[3])));
}